

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_decoder_config *
ma_decoder_config_init_copy(ma_decoder_config *__return_storage_ptr__,ma_decoder_config *pConfig)

{
  if (pConfig == (ma_decoder_config *)0x0) {
    if (__return_storage_ptr__ != (ma_decoder_config *)0x0) {
      memset(__return_storage_ptr__,0,0x90);
    }
  }
  else {
    memcpy(__return_storage_ptr__,pConfig,0x90);
  }
  return __return_storage_ptr__;
}

Assistant:

MA_API ma_decoder_config ma_decoder_config_init_copy(const ma_decoder_config* pConfig)
{
    ma_decoder_config config;
    if (pConfig != NULL) {
        config = *pConfig;
    } else {
        MA_ZERO_OBJECT(&config);
    }

    return config;
}